

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::setCapacity
          (Vector<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *this,size_t newSize)

{
  long lVar1;
  ArrayBuilder<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> newBuilder;
  
  lVar1 = (long)(this->builder).pos - (long)(this->builder).ptr;
  if (newSize < (ulong)(lVar1 / 0x30)) {
    ArrayBuilder<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::truncate
              (&this->builder,(char *)newSize,lVar1 % 0x30);
  }
  newBuilder.ptr =
       kj::_::HeapArrayDisposer::
       allocateUninitialized<kj::_::Tuple<kj::String,kj::Array<unsigned_long>>>(newSize);
  newBuilder.endPtr = newBuilder.ptr + newSize;
  newBuilder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  newBuilder.pos = newBuilder.ptr;
  ArrayBuilder<kj::_::Tuple<kj::String,kj::Array<unsigned_long>>>::
  addAll<kj::ArrayBuilder<kj::_::Tuple<kj::String,kj::Array<unsigned_long>>>>
            ((ArrayBuilder<kj::_::Tuple<kj::String,kj::Array<unsigned_long>>> *)&newBuilder,
             &this->builder);
  ArrayBuilder<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::operator=
            (&this->builder,&newBuilder);
  ArrayBuilder<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::dispose(&newBuilder);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }